

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O0

Node * __thiscall Parser::createIdentifierNode(Parser *this,Token *t)

{
  Node *token;
  Node *n;
  CompilationContext *in_stack_ffffffffffffffd8;
  Node *in_stack_ffffffffffffffe0;
  
  token = (Node *)operator_new(0x30);
  Node::Node(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(Token *)token);
  *(undefined4 *)&token->nodeType = 6;
  return token;
}

Assistant:

Node * createIdentifierNode(Token & t)
  {
    Node * n = new Node(ctx, t);
    n->nodeType = PNT_IDENTIFIER;
    return n;
  }